

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O0

OPJ_BOOL parse_precision(char *option,opj_decompress_parameters *parameters)

{
  void *pvVar1;
  opj_precision *l_new;
  int local_30;
  OPJ_UINT32 l_new_size;
  int count;
  char comma;
  OPJ_BOOL OStack_24;
  char mode;
  int prec;
  OPJ_BOOL l_result;
  char *l_remaining;
  opj_decompress_parameters *parameters_local;
  char *option_local;
  
  OStack_24 = 1;
  _prec = option;
  l_remaining = (char *)parameters;
  parameters_local = (opj_decompress_parameters *)option;
  if (parameters->precision != (opj_precision *)0x0) {
    free(parameters->precision);
    l_remaining[0x5060] = '\0';
    l_remaining[0x5061] = '\0';
    l_remaining[0x5062] = '\0';
    l_remaining[0x5063] = '\0';
    l_remaining[0x5064] = '\0';
    l_remaining[0x5065] = '\0';
    l_remaining[0x5066] = '\0';
    l_remaining[0x5067] = '\0';
  }
  l_remaining[0x5068] = '\0';
  l_remaining[0x5069] = '\0';
  l_remaining[0x506a] = '\0';
  l_remaining[0x506b] = '\0';
  while( true ) {
    local_30 = __isoc99_sscanf(_prec,"%d%c%c",&count,(long)&l_new_size + 3,(long)&l_new_size + 2);
    if (local_30 == 1) {
      l_new_size._3_1_ = 'C';
      local_30 = 2;
    }
    if ((local_30 == 2) || (l_new_size._3_1_ == ',')) {
      if (l_new_size._3_1_ == ',') {
        l_new_size._3_1_ = 'C';
      }
      l_new_size._2_1_ = ',';
      local_30 = 3;
    }
    if (local_30 != 3) {
      fprintf(_stderr,"Could not parse precision option %s\n",parameters_local);
      return 0;
    }
    if ((count < 1) || (0x20 < count)) {
      fprintf(_stderr,"Invalid precision %d in precision option %s\n",(ulong)(uint)count,
              parameters_local);
      return 0;
    }
    if ((l_new_size._3_1_ != 'C') && (l_new_size._3_1_ != 'S')) break;
    if (l_new_size._2_1_ != ',') {
      fprintf(_stderr,"Invalid character %c in precision option %s\n",
              (ulong)(uint)(int)l_new_size._2_1_,parameters_local);
      return 0;
    }
    if (*(long *)(l_remaining + 0x5060) == 0) {
      pvVar1 = malloc(8);
      *(void **)(l_remaining + 0x5060) = pvVar1;
      if (*(long *)(l_remaining + 0x5060) == 0) {
        fprintf(_stderr,"Could not allocate memory for precision option\n");
        return 0;
      }
    }
    else {
      if (*(int *)(l_remaining + 0x5068) + 1U == 0) {
        fprintf(_stderr,"Could not allocate memory for precision option\n");
        return 0;
      }
      pvVar1 = realloc(*(void **)(l_remaining + 0x5060),
                       (ulong)(*(int *)(l_remaining + 0x5068) + 1U) << 3);
      if (pvVar1 == (void *)0x0) {
        fprintf(_stderr,"Could not allocate memory for precision option\n");
        return 0;
      }
      *(void **)(l_remaining + 0x5060) = pvVar1;
    }
    *(int *)(*(long *)(l_remaining + 0x5060) + (ulong)*(uint *)(l_remaining + 0x5068) * 8) = count;
    if (l_new_size._3_1_ == 'C') {
      *(undefined4 *)
       (*(long *)(l_remaining + 0x5060) + 4 + (ulong)*(uint *)(l_remaining + 0x5068) * 8) = 0;
    }
    else if (l_new_size._3_1_ == 'S') {
      *(undefined4 *)
       (*(long *)(l_remaining + 0x5060) + 4 + (ulong)*(uint *)(l_remaining + 0x5068) * 8) = 1;
    }
    *(int *)(l_remaining + 0x5068) = *(int *)(l_remaining + 0x5068) + 1;
    _prec = strchr(_prec,0x2c);
    if (_prec == (char *)0x0) {
      return OStack_24;
    }
    _prec = _prec + 1;
  }
  fprintf(_stderr,"Invalid precision mode %c in precision option %s\n",
          (ulong)(uint)(int)l_new_size._3_1_,parameters_local);
  return 0;
}

Assistant:

static OPJ_BOOL parse_precision(const char* option,
                                opj_decompress_parameters* parameters)
{
    const char* l_remaining = option;
    OPJ_BOOL l_result = OPJ_TRUE;

    /* reset */
    if (parameters->precision) {
        free(parameters->precision);
        parameters->precision = NULL;
    }
    parameters->nb_precision = 0U;

    for (;;) {
        int prec;
        char mode;
        char comma;
        int count;

        count = sscanf(l_remaining, "%d%c%c", &prec, &mode, &comma);
        if (count == 1) {
            mode = 'C';
            count++;
        }
        if ((count == 2) || (mode == ',')) {
            if (mode == ',') {
                mode = 'C';
            }
            comma = ',';
            count = 3;
        }
        if (count == 3) {
            if ((prec < 1) || (prec > 32)) {
                fprintf(stderr, "Invalid precision %d in precision option %s\n", prec, option);
                l_result = OPJ_FALSE;
                break;
            }
            if ((mode != 'C') && (mode != 'S')) {
                fprintf(stderr, "Invalid precision mode %c in precision option %s\n", mode,
                        option);
                l_result = OPJ_FALSE;
                break;
            }
            if (comma != ',') {
                fprintf(stderr, "Invalid character %c in precision option %s\n", comma, option);
                l_result = OPJ_FALSE;
                break;
            }

            if (parameters->precision == NULL) {
                /* first one */
                parameters->precision = (opj_precision *)malloc(sizeof(opj_precision));
                if (parameters->precision == NULL) {
                    fprintf(stderr, "Could not allocate memory for precision option\n");
                    l_result = OPJ_FALSE;
                    break;
                }
            } else {
                OPJ_UINT32 l_new_size = parameters->nb_precision + 1U;
                opj_precision* l_new;

                if (l_new_size == 0U) {
                    fprintf(stderr, "Could not allocate memory for precision option\n");
                    l_result = OPJ_FALSE;
                    break;
                }

                l_new = (opj_precision *)realloc(parameters->precision,
                                                 l_new_size * sizeof(opj_precision));
                if (l_new == NULL) {
                    fprintf(stderr, "Could not allocate memory for precision option\n");
                    l_result = OPJ_FALSE;
                    break;
                }
                parameters->precision = l_new;
            }

            parameters->precision[parameters->nb_precision].prec = (OPJ_UINT32)prec;
            switch (mode) {
            case 'C':
                parameters->precision[parameters->nb_precision].mode = OPJ_PREC_MODE_CLIP;
                break;
            case 'S':
                parameters->precision[parameters->nb_precision].mode = OPJ_PREC_MODE_SCALE;
                break;
            default:
                break;
            }
            parameters->nb_precision++;

            l_remaining = strchr(l_remaining, ',');
            if (l_remaining == NULL) {
                break;
            }
            l_remaining += 1;
        } else {
            fprintf(stderr, "Could not parse precision option %s\n", option);
            l_result = OPJ_FALSE;
            break;
        }
    }

    return l_result;
}